

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

FederateState * __thiscall
helics::CommonCore::getFederateCore(CommonCore *this,string_view federateName)

{
  int iVar1;
  FedInfo **ppFVar2;
  long lVar3;
  FedInfo **ppFVar4;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_20;
  
  gmlc::containers::
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::find
            (&local_20,&this->loopFederates,federateName);
  iVar1 = (this->loopFederates).dataStorage.bsize;
  ppFVar2 = (this->loopFederates).dataStorage.dataptr;
  lVar3 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar2 == (FedInfo **)0x0) {
    ppFVar4 = &gmlc::containers::
               StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
               emptyValue;
  }
  else {
    ppFVar4 = ppFVar2 + lVar3 + 1;
  }
  ppFVar2 = ppFVar2 + lVar3;
  if (iVar1 == 0x20) {
    ppFVar2 = ppFVar4;
    iVar1 = 0;
  }
  if (ppFVar2 == local_20.vec) {
    if (iVar1 != local_20.offset) goto LAB_002ede1b;
  }
  else if ((((local_20.vec == (FedInfo **)0x0) || (ppFVar2 == (FedInfo **)0x0)) ||
           (*local_20.vec != (FedInfo *)0x0)) ||
          (iVar1 != local_20.offset || *ppFVar2 != (FedInfo *)0x0)) {
LAB_002ede1b:
    return (local_20.ptr)->fed;
  }
  return (FederateState *)0x0;
}

Assistant:

FederateState* CommonCore::getFederateCore(std::string_view federateName)
{
    auto fed = loopFederates.find(federateName);
    return (fed != loopFederates.end()) ? (fed->fed) : nullptr;
}